

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::getTECode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderTessellationInputPatchDiscard *this,
          _tessellation_primitive_mode primitive_mode)

{
  ulong uVar1;
  string *psVar2;
  _tessellation_primitive_mode primitive_mode_00;
  size_t primitive_mode_token_index;
  char *primitive_mode_token;
  string primitive_mode_string;
  allocator<char> local_1e;
  byte local_1d;
  _tessellation_primitive_mode local_1c;
  TessellationShaderTessellationInputPatchDiscard *pTStack_18;
  _tessellation_primitive_mode primitive_mode_local;
  TessellationShaderTessellationInputPatchDiscard *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = primitive_mode;
  pTStack_18 = this;
  this_local = (TessellationShaderTessellationInputPatchDiscard *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(PRIMITIVE_MODE) in;\n\nin  int   tc_primitive_id   [];\nout ivec2 te_tc_primitive_id;\nout int   te_primitive_id;\n\nvoid main()\n{\n    te_tc_primitive_id[0] = tc_primitive_id[0];\n    te_tc_primitive_id[1] = tc_primitive_id[1];\n    te_primitive_id       = gl_PrimitiveID;\n}\n"
             ,&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            ((string *)&primitive_mode_token,(TessellationShaderUtils *)(ulong)local_1c,
             primitive_mode_00);
  while( true ) {
    uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x2ae8de6);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)strlen("PRIMITIVE_MODE");
    psVar2 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,psVar2);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar2);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x2ae8de6);
  }
  local_1d = 1;
  std::__cxx11::string::~string((string *)&primitive_mode_token);
  if ((local_1d & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTessellationInputPatchDiscard::getTECode(_tessellation_primitive_mode primitive_mode)
{
	std::string result = "${VERSION}\n"
						 "\n"
						 "${TESSELLATION_SHADER_REQUIRE}\n"
						 "\n"
						 "layout(PRIMITIVE_MODE) in;\n"
						 "\n"
						 "in  int   tc_primitive_id   [];\n"
						 "out ivec2 te_tc_primitive_id;\n"
						 "out int   te_primitive_id;\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "    te_tc_primitive_id[0] = tc_primitive_id[0];\n"
						 "    te_tc_primitive_id[1] = tc_primitive_id[1];\n"
						 "    te_primitive_id       = gl_PrimitiveID;\n"
						 "}\n";

	/* Replace PRIMITIVE_MODE token with actual primitive_mode */
	std::string primitive_mode_string	  = TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
	const char* primitive_mode_token	   = "PRIMITIVE_MODE";
	std::size_t primitive_mode_token_index = std::string::npos;

	while ((primitive_mode_token_index = result.find(primitive_mode_token)) != std::string::npos)
	{
		result = result.replace(primitive_mode_token_index, strlen(primitive_mode_token), primitive_mode_string);

		primitive_mode_token_index = result.find(primitive_mode_token);
	}

	/* Done */
	return result;
}